

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qinputdialog.cpp
# Opt level: O1

void QInputDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QInputDialog_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == textValueChanged) && (uVar2 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == textValueSelected && (uVar2 = 1, plVar1[1] == 0)))) ||
       (((((code *)*plVar1 == intValueChanged && (uVar2 = 2, plVar1[1] == 0)) ||
         (((code *)*plVar1 == intValueSelected && (uVar2 = 3, plVar1[1] == 0)))) ||
        ((((code *)*plVar1 == doubleValueChanged && (uVar2 = 4, plVar1[1] == 0)) ||
         (((code *)*plVar1 == doubleValueSelected && (uVar2 = 5, plVar1[1] == 0)))))))) {
      *(undefined4 *)*_a = uVar2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      puStack_20 = (undefined8 *)_a[1];
      iVar3 = 0;
      break;
    case 1:
      puStack_20 = (undefined8 *)_a[1];
      iVar3 = 1;
      break;
    case 2:
      puStack_20 = &local_30;
      local_30 = CONCAT44(local_30._4_4_,*_a[1]);
      iVar3 = 2;
      break;
    case 3:
      puStack_20 = &local_30;
      local_30 = CONCAT44(local_30._4_4_,*_a[1]);
      iVar3 = 3;
      break;
    case 4:
      local_30 = *_a[1];
      puStack_20 = &local_30;
      iVar3 = 4;
      break;
    case 5:
      local_30 = *_a[1];
      puStack_20 = &local_30;
      iVar3 = 5;
      break;
    default:
      goto LAB_0050a082;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
  }
LAB_0050a082:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QInputDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textValueChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textValueSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->intValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->intValueSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->doubleValueChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 5: _t->doubleValueSelected((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueSelected, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueSelected, 5))
            return;
    }
}